

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

uint32 * rw::ps2::instanceXYZW(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  Object *pOVar3;
  int8 *piVar4;
  undefined4 uVar5;
  bool bVar6;
  uint local_44;
  uint32 i;
  int8 *adcbits;
  uint32 *d;
  uint16 j;
  uint32 n_local;
  uint32 idx_local;
  Mesh *m_local;
  Geometry *g_local;
  uint32 *p_local;
  
  pVVar2 = g->morphTargets->vertices;
  piVar4 = getADCbitsForMesh(g,m);
  g_local = (Geometry *)p;
  for (local_44 = idx; local_44 < idx + n; local_44 = local_44 + 1) {
    uVar1 = m->indices[local_44];
    *(float32 *)&g_local->object = (&pVVar2->x)[(int)((uint)uVar1 * 3)];
    *(float32 *)&(g_local->object).field_0x4 = (&pVVar2->x)[(int)((uint)uVar1 * 3 + 1)];
    pOVar3 = &g_local->object;
    *(float32 *)&(g_local->object).parent = (&pVVar2->x)[(int)((uint)uVar1 * 3 + 2)];
    bVar6 = false;
    if (piVar4 != (int8 *)0x0) {
      bVar6 = piVar4[local_44] != '\0';
    }
    uVar5 = 0;
    if (bVar6) {
      uVar5 = 0x8000;
    }
    g_local = (Geometry *)&g_local->flags;
    *(undefined4 *)((long)&pOVar3->parent + 4) = uVar5;
  }
  return (uint32 *)g_local;
}

Assistant:

uint32*
instanceXYZW(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->morphTargets[0].vertices;
	int8 *adcbits = getADCbitsForMesh(g, m);
	for(uint32 i = idx; i < idx+n; i++){
		j = m->indices[i];
		*p++ = d[j*3+0];
		*p++ = d[j*3+1];
		*p++ = d[j*3+2];
		*p++ = adcbits && adcbits[i] ? 0x8000 : 0;
	}
	// don't need to pad
	return p;
}